

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MutexBenchmarks.hpp
# Opt level: O2

void __thiscall
benchmarks::MutexBenchmarks<descriptors::mutex::boost::RecursiveMutex>::MutexBenchmarks
          (MutexBenchmarks<descriptors::mutex::boost::RecursiveMutex> *this)

{
  allocator local_69;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_68;
  string local_50;
  string local_30;
  
  std::__cxx11::string::string((string *)&local_30,"mutex",&local_69);
  BenchmarksClass::BenchmarksClass(&this->super_BenchmarksClass,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  std::__cxx11::string::string((string *)&local_50,"basic",&local_69);
  local_68.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_68.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_68.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  BenchmarksClass::AddBenchmark<,void(*)(benchmarks::BenchmarkContext&)>
            (&this->super_BenchmarksClass,&local_50,Basic,&local_68);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_68);
  std::__cxx11::string::~string((string *)&local_50);
  return;
}

Assistant:

MutexBenchmarks()
            : BenchmarksClass("mutex")
        {
            AddBenchmark<>("basic", &MutexBenchmarks::Basic);
        }